

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_chr
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  buffer<char> *pbVar1;
  unsigned_long uVar2;
  size_t sVar3;
  ulong uVar4;
  
  pbVar1 = (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  uVar2 = this->abs_value;
  sVar3 = pbVar1->size_;
  uVar4 = sVar3 + 1;
  if (pbVar1->capacity_ < uVar4) {
    (**pbVar1->_vptr_buffer)(pbVar1);
    sVar3 = pbVar1->size_;
    uVar4 = sVar3 + 1;
  }
  pbVar1->size_ = uVar4;
  pbVar1->ptr_[sVar3] = (char)uVar2;
  return;
}

Assistant:

void on_chr() { *out++ = static_cast<Char>(abs_value); }